

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

QString * __thiscall
anon_unknown.dwarf_133c8f4::errorMessageForSyscall
          (QString *__return_storage_ptr__,anon_unknown_dwarf_133c8f4 *this,QUtf8StringView fnName,
          int errnoCode)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  QUtf8StringView fnName_local;
  
  fnName_local.m_size = (qsizetype)fnName.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  fnName_local.m_data = (storage_type *)this;
  qt_error_string((QString *)&local_38,(int)fnName.m_size);
  QProcess::tr((QString *)&local_50,"Child process set up failed: %1: %2",(char *)0x0,-1);
  QString::arg<QBasicUtf8StringView<false>&,QString>
            (__return_storage_ptr__,(QString *)&local_50,&fnName_local,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString errorMessageForSyscall(QUtf8StringView fnName, int errnoCode = -1)
{
    QString msg = qt_error_string(errnoCode);
    return QProcess::tr("Child process set up failed: %1: %2").arg(fnName, std::move(msg));
}